

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode parse_hostname_login(Curl_URL *u,Curl_handler *h,char **hostname,uint flags)

{
  char *__s;
  CURLcode CVar1;
  char *pcVar2;
  char **optionsp_00;
  CURLUcode CVar3;
  char *pcVar4;
  char *optionsp;
  char *passwdp;
  char *userp;
  char *local_50;
  char *local_48;
  uint local_3c;
  char *local_38;
  
  local_38 = (char *)0x0;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  __s = *hostname;
  local_3c = flags;
  pcVar2 = strchr(__s,0x40);
  CVar3 = CURLUE_OK;
  pcVar4 = (char *)0x0;
  if (pcVar2 != (char *)0x0) {
    *hostname = pcVar2 + 1;
    if ((h == (Curl_handler *)0x0) || ((h->flags & 0x400) == 0)) {
      optionsp_00 = (char **)0x0;
    }
    else {
      optionsp_00 = &local_50;
    }
    CVar1 = Curl_parse_login_details
                      (__s,(size_t)(pcVar2 + ~(ulong)__s + 1),&local_38,&local_48,optionsp_00);
    CVar3 = CURLUE_MALFORMED_INPUT;
    pcVar4 = local_38;
    if (CVar1 == CURLE_OK) {
      if (local_38 != (char *)0x0) {
        CVar3 = CURLUE_USER_NOT_ALLOWED;
        if ((local_3c & 0x20) != 0) goto LAB_004ca54a;
        u->user = local_38;
      }
      if (local_48 != (char *)0x0) {
        u->password = local_48;
      }
      if (local_50 == (char *)0x0) {
        return CURLUE_OK;
      }
      u->options = local_50;
      return CURLUE_OK;
    }
  }
LAB_004ca54a:
  (*Curl_cfree)(pcVar4);
  (*Curl_cfree)(local_48);
  (*Curl_cfree)(local_50);
  return CVar3;
}

Assistant:

static CURLUcode parse_hostname_login(struct Curl_URL *u,
                                      const struct Curl_handler *h,
                                      char **hostname,
                                      unsigned int flags)
{
  CURLUcode result = CURLUE_OK;
  CURLcode ccode;
  char *userp = NULL;
  char *passwdp = NULL;
  char *optionsp = NULL;

  /* At this point, we're hoping all the other special cases have
   * been taken care of, so conn->host.name is at most
   *    [user[:password][;options]]@]hostname
   *
   * We need somewhere to put the embedded details, so do that first.
   */

  char *ptr = strchr(*hostname, '@');
  char *login = *hostname;

  if(!ptr)
    goto out;

  /* We will now try to extract the
   * possible login information in a string like:
   * ftp://user:password@ftp.my.site:8021/README */
  *hostname = ++ptr;

  /* We could use the login information in the URL so extract it. Only parse
     options if the handler says we should. Note that 'h' might be NULL! */
  ccode = Curl_parse_login_details(login, ptr - login - 1,
                                   &userp, &passwdp,
                                   (h && (h->flags & PROTOPT_URLOPTIONS)) ?
                                   &optionsp:NULL);
  if(ccode) {
    result = CURLUE_MALFORMED_INPUT;
    goto out;
  }

  if(userp) {
    if(flags & CURLU_DISALLOW_USER) {
      /* Option DISALLOW_USER is set and url contains username. */
      result = CURLUE_USER_NOT_ALLOWED;
      goto out;
    }

    u->user = userp;
  }

  if(passwdp)
    u->password = passwdp;

  if(optionsp)
    u->options = optionsp;

  return CURLUE_OK;
  out:

  free(userp);
  free(passwdp);
  free(optionsp);

  return result;
}